

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result_opt_conflict * __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::lte_key_byte(iter_result_opt_conflict *__return_storage_ptr__,
              basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              *this,byte key_byte)

{
  byte bVar1;
  _Optional_payload<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true,_true>
  *p_Var2;
  undefined7 uVar3;
  undefined1 uVar4;
  uintptr_t uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(byte)this->field_0x8;
  do {
    if ((long)uVar6 < 1) {
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload + 8) = 0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.prefix.u64 = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_engaged = 0;
      return __return_storage_ptr__;
    }
    uVar6 = uVar6 - 1;
    bVar1 = *(byte *)((long)(this->children)._M_elems + ((uVar6 & 0xff) - 4));
  } while (key_byte < bVar1);
  uVar5 = basic_node_ptr<unodb::detail::node_header>::tag_ptr((node_header *)this,I4);
  uVar3 = *(undefined7 *)&this->field_0x0;
  uVar4 = this->field_0x7;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.node.tagged_ptr = uVar5;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.key_byte = bVar1;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.child_index = (uint8_t)uVar6;
  p_Var2 = &(__return_storage_ptr__->
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            )._M_payload;
  *(undefined7 *)
   ((long)&(p_Var2->
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>).
           _M_payload + 0x10) = uVar3;
  *(undefined1 *)
   ((long)&(p_Var2->
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>).
           _M_payload + 0x17) = uVar4;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_4::iter_result_opt
  lte_key_byte(std::byte key_byte) noexcept {
    const auto children_count_ = this->children_count.load();
    for (std::int64_t i = children_count_ - 1; i >= 0; i--) {
      const auto child_index = static_cast<std::uint8_t>(i);
      const auto key = keys.byte_array[child_index].load();
      if (key <= key_byte) {
        return {{node_ptr{this, node_type::I4}, key, child_index,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    // The first key in the node is GT the given key_byte.
    return parent_class::end_result;
  }